

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transreg.cpp
# Opt level: O2

TransliteratorEntry *
icu_63::TransliteratorRegistry::findInBundle
          (TransliteratorSpec *specToOpen,TransliteratorSpec *specToFind,UnicodeString *variant,
          UTransDirection direction)

{
  short sVar1;
  ResourceBundle *this;
  UBool UVar2;
  int iVar3;
  UTransDirection UVar4;
  UnicodeString *pUVar5;
  CharString *pCVar6;
  Locale *pLVar7;
  TransliteratorEntry *pTVar8;
  undefined1 *puVar9;
  char16_t *__length;
  __off_t __length_00;
  char16_t *extraout_RDX;
  int iVar10;
  UErrorCode local_294;
  ConstChar16Ptr local_290;
  ConstChar16Ptr local_288;
  UTransDirection local_27c;
  UnicodeString *local_278;
  ResourceBundle subres;
  UnicodeString resStr;
  UnicodeString utag;
  CharString local_190;
  UnicodeString s;
  Locale local_110;
  
  utag.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  utag.fUnion.fStackFields.fLengthAndFlags = 2;
  resStr.super_Replaceable.super_UObject._vptr_UObject = (UObject)&PTR__UnicodeString_00471e80;
  puVar9 = TRANSLITERATE_FROM;
  if (direction == UTRANS_FORWARD) {
    puVar9 = TRANSLITERATE_TO;
  }
  resStr.fUnion.fStackFields.fLengthAndFlags = 2;
  iVar10 = 0;
  __length = (char16_t *)puVar9;
  local_27c = direction;
  local_278 = variant;
  do {
    pTVar8 = (TransliteratorEntry *)0x0;
    if (iVar10 == 2) {
LAB_00274c54:
      icu_63::UnicodeString::~UnicodeString(&resStr);
      icu_63::UnicodeString::~UnicodeString(&utag);
      return pTVar8;
    }
    icu_63::UnicodeString::truncate(&utag,(char *)0x0,(__off_t)__length);
    if (iVar10 == 0) {
      local_288.p_ = (char16_t *)puVar9;
      icu_63::UnicodeString::append(&utag,&local_288,-1);
    }
    else {
      local_290.p_ = (char16_t *)TRANSLITERATE;
      icu_63::UnicodeString::append(&utag,&local_290,-1);
    }
    icu_63::UnicodeString::UnicodeString(&s,&specToFind->spec);
    Locale::Locale(&local_110,"",(char *)0x0,(char *)0x0,(char *)0x0);
    pUVar5 = icu_63::UnicodeString::toUpper(&s,&local_110);
    icu_63::UnicodeString::append(&utag,pUVar5);
    Locale::~Locale(&local_110);
    local_294 = U_ZERO_ERROR;
    this = specToOpen->res;
    MaybeStackArray<char,_40>::MaybeStackArray((MaybeStackArray<char,_40> *)&local_110);
    local_110.fullNameBuffer[8] = '\0';
    local_110.fullNameBuffer[9] = '\0';
    local_110.fullNameBuffer[10] = '\0';
    local_110.fullNameBuffer[0xb] = '\0';
    *(undefined1 *)local_110.super_UObject._vptr_UObject = 0;
    pCVar6 = CharString::appendInvariantChars((CharString *)&local_110,&utag,&local_294);
    ResourceBundle::get(&subres,this,(pCVar6->buffer).ptr,&local_294);
    MaybeStackArray<char,_40>::~MaybeStackArray((MaybeStackArray<char,_40> *)&local_110);
    if (local_294 != U_USING_DEFAULT_WARNING && local_294 < U_ILLEGAL_ARGUMENT_ERROR) {
      icu_63::UnicodeString::truncate(&s,(char *)0x0,__length_00);
      pLVar7 = ResourceBundle::getLocale(&subres);
      pUVar5 = LocaleUtility::initNameFromLocale(pLVar7,&s);
      UVar2 = icu_63::UnicodeString::operator!=(&specToOpen->spec,pUVar5);
      if (UVar2 == '\0') {
        sVar1 = (local_278->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar3 = (local_278->fUnion).fFields.fLength;
        }
        else {
          iVar3 = (int)sVar1 >> 5;
        }
        local_294 = U_ZERO_ERROR;
        pLVar7 = &local_110;
        if (iVar3 == 0) {
          ResourceBundle::getStringEx((UnicodeString *)&local_110,&subres,1,&local_294);
          icu_63::UnicodeString::moveFrom(&resStr,(UnicodeString *)&local_110);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_110);
        }
        else {
          MaybeStackArray<char,_40>::MaybeStackArray(&local_190.buffer);
          local_190.len = 0;
          *local_190.buffer.ptr = '\0';
          pCVar6 = CharString::appendInvariantChars(&local_190,local_278,&local_294);
          ResourceBundle::getStringEx
                    ((UnicodeString *)&local_110,&subres,(pCVar6->buffer).ptr,&local_294);
          icu_63::UnicodeString::moveFrom(&resStr,(UnicodeString *)&local_110);
          icu_63::UnicodeString::~UnicodeString((UnicodeString *)&local_110);
          MaybeStackArray<char,_40>::~MaybeStackArray(&local_190.buffer);
        }
        if (local_294 < U_ILLEGAL_ARGUMENT_ERROR) {
          ResourceBundle::~ResourceBundle(&subres);
          icu_63::UnicodeString::~UnicodeString(&s);
          pTVar8 = (TransliteratorEntry *)UMemory::operator_new((UMemory *)0x68,(size_t)pLVar7);
          if (pTVar8 == (TransliteratorEntry *)0x0) {
            pTVar8 = (TransliteratorEntry *)0x0;
          }
          else {
            (pTVar8->stringArg).super_Replaceable.super_UObject._vptr_UObject =
                 (_func_int **)&PTR__UnicodeString_00471e80;
            (pTVar8->stringArg).fUnion.fStackFields.fLengthAndFlags = 2;
            pTVar8->compoundFilter = (UnicodeSet *)0x0;
            (pTVar8->u).prototype = (Transliterator *)0x0;
            pTVar8->entryType = LOCALE_RULES;
            icu_63::UnicodeString::operator=(&pTVar8->stringArg,&resStr);
            UVar4 = local_27c;
            if (iVar10 == 0) {
              UVar4 = UTRANS_FORWARD;
            }
            pTVar8->intArg = UVar4;
          }
          goto LAB_00274c54;
        }
      }
    }
    ResourceBundle::~ResourceBundle(&subres);
    icu_63::UnicodeString::~UnicodeString(&s);
    iVar10 = iVar10 + 1;
    __length = extraout_RDX;
  } while( true );
}

Assistant:

TransliteratorEntry* TransliteratorRegistry::findInBundle(const TransliteratorSpec& specToOpen,
                                            const TransliteratorSpec& specToFind,
                                            const UnicodeString& variant,
                                            UTransDirection direction)
{
    UnicodeString utag;
    UnicodeString resStr;
    int32_t pass;

    for (pass=0; pass<2; ++pass) {
        utag.truncate(0);
        // First try either TransliteratorTo_xxx or
        // TransliterateFrom_xxx, then try the bidirectional
        // Transliterate_xxx.  This precedence order is arbitrary
        // but must be consistent and documented.
        if (pass == 0) {
            utag.append(direction == UTRANS_FORWARD ?
                        TRANSLITERATE_TO : TRANSLITERATE_FROM, -1);
        } else {
            utag.append(TRANSLITERATE, -1);
        }
        UnicodeString s(specToFind.get());
        utag.append(s.toUpper(""));
        UErrorCode status = U_ZERO_ERROR;
        ResourceBundle subres(specToOpen.getBundle().get(
            CharString().appendInvariantChars(utag, status).data(), status));
        if (U_FAILURE(status) || status == U_USING_DEFAULT_WARNING) {
            continue;
        }

        s.truncate(0);
        if (specToOpen.get() != LocaleUtility::initNameFromLocale(subres.getLocale(), s)) {
            continue;
        }

        if (variant.length() != 0) {
            status = U_ZERO_ERROR;
            resStr = subres.getStringEx(
                CharString().appendInvariantChars(variant, status).data(), status);
            if (U_SUCCESS(status)) {
                // Exit loop successfully
                break;
            }
        } else {
            // Variant is empty, which means match the first variant listed.
            status = U_ZERO_ERROR;
            resStr = subres.getStringEx(1, status);
            if (U_SUCCESS(status)) {
                // Exit loop successfully
                break;
            }
        }
    }

    if (pass==2) {
        // Failed
        return NULL;
    }

    // We have succeeded in loading a string from the locale
    // resources.  Create a new registry entry to hold it and return it.
    TransliteratorEntry *entry = new TransliteratorEntry();
    if (entry != 0) {
        // The direction is always forward for the
        // TransliterateTo_xxx and TransliterateFrom_xxx
        // items; those are unidirectional forward rules.
        // For the bidirectional Transliterate_xxx items,
        // the direction is the value passed in to this
        // function.
        int32_t dir = (pass == 0) ? UTRANS_FORWARD : direction;
        entry->entryType = TransliteratorEntry::LOCALE_RULES;
        entry->stringArg = resStr;
        entry->intArg = dir;
    }

    return entry;
}